

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O0

void saslclientio_destroy(CONCRETE_IO_HANDLE sasl_client_io)

{
  LOGGER_LOG p_Var1;
  SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance;
  LOGGER_LOG l;
  CONCRETE_IO_HANDLE sasl_client_io_local;
  
  if (sasl_client_io == (CONCRETE_IO_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
                ,"saslclientio_destroy",0x40e,1,"NULL sasl_client_io");
    }
  }
  else {
    sasl_frame_codec_destroy(*(SASL_FRAME_CODEC_HANDLE *)((long)sasl_client_io + 0x58));
    frame_codec_destroy(*(FRAME_CODEC_HANDLE *)((long)sasl_client_io + 0x60));
    free(sasl_client_io);
  }
  return;
}

Assistant:

void saslclientio_destroy(CONCRETE_IO_HANDLE sasl_client_io)
{
    if (sasl_client_io == NULL)
    {
        /* Codes_SRS_SASLCLIENTIO_01_008: [If the argument `sasl_client_io` is NULL, `saslclientio_destroy` shall do nothing.] */
        LogError("NULL sasl_client_io");
    }
    else
    {
        SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE*)sasl_client_io;

        /* Codes_SRS_SASLCLIENTIO_01_007: [`saslclientio_destroy` shall free all resources associated with the SASL client IO handle.] */
        /* Codes_SRS_SASLCLIENTIO_01_086: [`saslclientio_destroy` shall destroy the SASL frame codec created in `saslclientio_create` by calling `sasl_frame_codec_destroy`.] */
        sasl_frame_codec_destroy(sasl_client_io_instance->sasl_frame_codec);

        /* Codes_SRS_SASLCLIENTIO_01_091: [`saslclientio_destroy` shall destroy the frame codec created in `saslclientio_create` by calling `frame_codec_destroy`.] */
        frame_codec_destroy(sasl_client_io_instance->frame_codec);
        free(sasl_client_io);
    }
}